

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O2

string_t __thiscall
duckdb::DecimalToString::Format<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale,Vector *vector)

{
  int val;
  Vector *vector_00;
  char *dst;
  idx_t len;
  undefined7 in_register_00000081;
  uint8_t scale_00;
  hugeint_t value_00;
  string_t result;
  idx_t in_stack_ffffffffffffffb8;
  anon_union_16_2_67f50693_for_value local_40;
  
  val = DecimalLength<duckdb::hugeint_t>(this,value,width,scale);
  vector_00 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_40.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)CONCAT71(in_register_00000081,scale),vector_00,len)
  ;
  scale_00 = (char)&local_40 + '\x04';
  if (0xc < local_40._0_4_) {
    scale_00 = local_40.inlined.inlined[4];
  }
  dst = (char *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  value_00.upper._4_4_ = 0;
  value_00._0_12_ = value._0_12_;
  FormatDecimal<duckdb::hugeint_t>(this,value_00,width,scale_00,dst,in_stack_ffffffffffffffb8);
  string_t::Finalize((string_t *)&local_40.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_40.pointer;
}

Assistant:

string_t DecimalToString::Format(hugeint_t value, uint8_t width, uint8_t scale, Vector &vector) {
	int length = DecimalLength(value, width, scale);
	string_t result = StringVector::EmptyString(vector, NumericCast<idx_t>(length));

	auto dst = result.GetDataWriteable();

	FormatDecimal(value, width, scale, dst, NumericCast<idx_t>(length));

	result.Finalize();
	return result;
}